

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Source.cpp
# Opt level: O0

void __thiscall helics::apps::Source::Source(Source *this,string_view appName,FederateInfo *fedInfo)

{
  string_view appName_00;
  char *in_RCX;
  App *in_RDX;
  FederateInfo *in_RSI;
  undefined8 *in_RDI;
  undefined8 *t;
  Source *this_00;
  size_t in_stack_ffffffffffffffd8;
  
  appName_00._M_str = in_RCX;
  appName_00._M_len = in_stack_ffffffffffffffd8;
  App::App(in_RDX,appName_00,in_RSI);
  *in_RDI = &PTR__Source_009be350;
  CLI::std::deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_>::deque
            ((deque<helics::apps::SourceObject,_std::allocator<helics::apps::SourceObject>_> *)
             0x235ed4);
  t = in_RDI + 0x1e;
  CLI::std::
  vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
  ::vector((vector<std::shared_ptr<helics::apps::SignalGenerator>,_std::allocator<std::shared_ptr<helics::apps::SignalGenerator>_>_>
            *)0x235eeb);
  this_00 = (Source *)(in_RDI + 0x21);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x235f01);
  CLI::std::vector<helics::Endpoint,_std::allocator<helics::Endpoint>_>::vector
            ((vector<helics::Endpoint,_std::allocator<helics::Endpoint>_> *)0x235f17);
  CLI::std::
  map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::map((map<std::basic_string_view<char,_std::char_traits<char>_>,_int,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
         *)0x235f2d);
  TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
            ((TimeRepresentation<count_time<9,_long>_> *)this_00,(double)t);
  initialSetup(this_00);
  return;
}

Assistant:

Source::Source(std::string_view appName, const FederateInfo& fedInfo): App(appName, fedInfo)
    {
        initialSetup();
    }